

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::
InternalGenerateInlineAccessorDefinitions
          (MessageOneofFieldGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables,Printer *printer)

{
  Descriptor *pDVar1;
  char *pcVar2;
  char *text;
  
  io::Printer::Print(printer,variables,
                     "$tmpl$$inline$ const $type$& $dependent_classname$::$name$() const {\n  // @@protoc_insertion_point(field_get:$full_name$)\n  return $this_const_message$has_$name$()\n      ? *$this_const_message$$oneof_prefix$$name$_\n      : $dependent_type$::default_instance();\n}\n"
                    );
  if (*(char *)(*(long *)(*(long *)((this->super_MessageFieldGenerator).descriptor_ + 0x30) + 0xa0)
               + 0xa7) == '\x01') {
    io::Printer::Print(printer,variables,
                       "$tmpl$$inline$$type$* $dependent_classname$::mutable_$name$() {\n  if (!$this_message$has_$name$()) {\n    $this_message$clear_$oneof_name$();\n    $this_message$set_has_$name$();\n"
                      );
    pDVar1 = FieldDescriptor::message_type((this->super_MessageFieldGenerator).descriptor_);
    pcVar2 = 
    "    $this_message$$oneof_prefix$$name$_ = \n      ::google::protobuf::Arena::Create< $dependent_typename$ >(\n      $this_message$GetArenaNoVirtual());\n"
    ;
    if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0xa0) + 0xa7) != '\0') {
      pcVar2 = 
      "    $field_member$ = \n      ::google::protobuf::Arena::CreateMessage< $dependent_typename$ >(\n      $this_message$GetArenaNoVirtual());\n"
      ;
    }
    io::Printer::Print(printer,variables,pcVar2);
    io::Printer::Print(printer,variables,
                       "  }\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return $field_member$;\n}\n$tmpl$$inline$$type$* $dependent_classname$::$release_name$() {\n  // @@protoc_insertion_point(field_release:$full_name$)\n  if ($this_message$has_$name$()) {\n    $this_message$clear_has_$oneof_name$();\n    if ($this_message$GetArenaNoVirtual() != NULL) {\n      $dependent_typename$* temp = new $dependent_typename$(*$field_member$);\n      $field_member$ = NULL;\n      return temp;\n    } else {\n      $dependent_typename$* temp = $field_member$;\n      $field_member$ = NULL;\n      return temp;\n    }\n  } else {\n    return NULL;\n  }\n}\n$tmpl$$inline$void $dependent_classname$::set_allocated_$name$($type$* $name$) {\n  $this_message$clear_$oneof_name$();\n  if ($name$) {\n"
                      );
    pDVar1 = FieldDescriptor::message_type((this->super_MessageFieldGenerator).descriptor_);
    text = 
    "    if ($this_message$GetArenaNoVirtual() != NULL) {\n      $this_message$GetArenaNoVirtual()->Own($name$);\n    }\n"
    ;
    if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0xa0) + 0xa7) != '\0') {
      text = 
      "    if ($this_message$GetArenaNoVirtual() != NULL &&\n        ::google::protobuf::Arena::GetArena($name$) == NULL) {\n      $this_message$GetArenaNoVirtual()->Own($name$);\n    } else if ($this_message$GetArenaNoVirtual() !=\n               ::google::protobuf::Arena::GetArena($name$)) {\n      $dependent_typename$* new_$name$ = \n          ::google::protobuf::Arena::CreateMessage< $dependent_typename$ >(\n          $this_message$GetArenaNoVirtual());\n      new_$name$->CopyFrom(*$name$);\n      $name$ = new_$name$;\n    }\n"
      ;
    }
    pcVar2 = 
    "    $this_message$set_has_$name$();\n    $field_member$ = $name$;\n  }\n  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n$inline$ $type$* $classname$::unsafe_arena_release_$name$() {\n  // @@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n  if (has_$name$()) {\n    clear_has_$oneof_name$();\n    $type$* temp = $oneof_prefix$$name$_;\n    $oneof_prefix$$name$_ = NULL;\n    return temp;\n  } else {\n    return NULL;\n  }\n}\n$inline$ void $classname$::unsafe_arena_set_allocated_$name$($type$* $name$) {\n  clear_$oneof_name$();\n  if ($name$) {\n    set_has_$name$();\n    $oneof_prefix$$name$_ = $name$;\n  }\n  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:$full_name$)\n}\n"
    ;
  }
  else {
    io::Printer::Print(printer,variables,
                       "$tmpl$$inline$$type$* $dependent_classname$::mutable_$name$() {\n  if (!$this_message$has_$name$()) {\n    $this_message$clear_$oneof_name$();\n    $this_message$set_has_$name$();\n    $field_member$ = new $dependent_typename$;\n  }\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return $field_member$;\n}\n$tmpl$$inline$$type$* $dependent_classname$::$release_name$() {\n  // @@protoc_insertion_point(field_release:$full_name$)\n  if ($this_message$has_$name$()) {\n    $this_message$clear_has_$oneof_name$();\n    $dependent_typename$* temp = $field_member$;\n    $field_member$ = NULL;\n    return temp;\n  } else {\n    return NULL;\n  }\n}\n$tmpl$$inline$void $dependent_classname$::set_allocated_$name$($type$* $name$) {\n  $this_message$clear_$oneof_name$();\n  if ($name$) {\n"
                      );
    pDVar1 = FieldDescriptor::message_type((this->super_MessageFieldGenerator).descriptor_);
    pcVar2 = 
    "    $this_message$set_has_$name$();\n    $field_member$ = $name$;\n  }\n  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
    ;
    if (*(char *)(*(long *)(*(long *)(pDVar1 + 0x10) + 0xa0) + 0xa7) != '\x01') goto LAB_00289659;
    text = 
    "    if (static_cast< $dependent_typename$*>($name$)->GetArena() != NULL) {\n      $dependent_typename$* new_$name$ = new $dependent_typename$;\n      new_$name$->CopyFrom(*$name$);\n      $name$ = new_$name$;\n    }\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
LAB_00289659:
  io::Printer::Print(printer,variables,pcVar2);
  return;
}

Assistant:

void MessageOneofFieldGenerator::InternalGenerateInlineAccessorDefinitions(
    const std::map<string, string>& variables, io::Printer* printer) const {
  printer->Print(variables,
    "$tmpl$"
    "$inline$ "
    "const $type$& $dependent_classname$::$name$() const {\n"
    "  // @@protoc_insertion_point(field_get:$full_name$)\n"
    "  return $this_const_message$has_$name$()\n"
    "      ? *$this_const_message$$oneof_prefix$$name$_\n"
    "      : $dependent_type$::default_instance();\n"
    "}\n");

  if (SupportsArenas(descriptor_)) {
    printer->Print(variables,
      "$tmpl$"
      "$inline$"
      "$type$* $dependent_classname$::mutable_$name$() {\n"
      "  if (!$this_message$has_$name$()) {\n"
      "    $this_message$clear_$oneof_name$();\n"
      "    $this_message$set_has_$name$();\n");
    if (SupportsArenas(descriptor_->message_type())) {
      printer->Print(variables,
         "    $field_member$ = \n"
         "      ::google::protobuf::Arena::CreateMessage< $dependent_typename$ >(\n"
         "      $this_message$GetArenaNoVirtual());\n");
    } else {
      printer->Print(variables,
         "    $this_message$$oneof_prefix$$name$_ = \n"
         "      ::google::protobuf::Arena::Create< $dependent_typename$ >(\n"
         "      $this_message$GetArenaNoVirtual());\n");
    }
    printer->Print(variables,
      "  }\n"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return $field_member$;\n"
      "}\n"
      "$tmpl$"
      "$inline$"
      "$type$* $dependent_classname$::$release_name$() {\n"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "  if ($this_message$has_$name$()) {\n"
      "    $this_message$clear_has_$oneof_name$();\n"
      "    if ($this_message$GetArenaNoVirtual() != NULL) {\n"
      // N.B.: safe to use the underlying field pointer here because we are sure
      // that it is non-NULL (because has_$name$() returned true).
      "      $dependent_typename$* temp = "
      "new $dependent_typename$(*$field_member$);\n"
      "      $field_member$ = NULL;\n"
      "      return temp;\n"
      "    } else {\n"
      "      $dependent_typename$* temp = $field_member$;\n"
      "      $field_member$ = NULL;\n"
      "      return temp;\n"
      "    }\n"
      "  } else {\n"
      "    return NULL;\n"
      "  }\n"
      "}\n"
      "$tmpl$"
      "$inline$"
      "void $dependent_classname$::"
      "set_allocated_$name$($type$* $name$) {\n"
      "  $this_message$clear_$oneof_name$();\n"
      "  if ($name$) {\n");

    if (SupportsArenas(descriptor_->message_type())) {
      printer->Print(variables,
        // If incoming message is on the heap and we are on an arena, just Own()
        // it (see above). If it's on a different arena than we are or one of us
        // is on the heap, we make a copy to our arena/heap.
        "    if ($this_message$GetArenaNoVirtual() != NULL &&\n"
        "        ::google::protobuf::Arena::GetArena($name$) == NULL) {\n"
        "      $this_message$GetArenaNoVirtual()->Own($name$);\n"
        "    } else if ($this_message$GetArenaNoVirtual() !=\n"
        "               ::google::protobuf::Arena::GetArena($name$)) {\n"
        "      $dependent_typename$* new_$name$ = \n"
        "          ::google::protobuf::Arena::CreateMessage< $dependent_typename$ >(\n"
        "          $this_message$GetArenaNoVirtual());\n"
        "      new_$name$->CopyFrom(*$name$);\n"
        "      $name$ = new_$name$;\n"
        "    }\n");
    } else {
      printer->Print(variables,
        "    if ($this_message$GetArenaNoVirtual() != NULL) {\n"
        "      $this_message$GetArenaNoVirtual()->Own($name$);\n"
        "    }\n");
    }

    printer->Print(variables,
      "    $this_message$set_has_$name$();\n"
      "    $field_member$ = $name$;\n"
      "  }\n"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n"
      "$inline$ $type$* $classname$::unsafe_arena_release_$name$() {\n"
      "  // @@protoc_insertion_point(field_unsafe_arena_release"
      ":$full_name$)\n"
      "  if (has_$name$()) {\n"
      "    clear_has_$oneof_name$();\n"
      "    $type$* temp = $oneof_prefix$$name$_;\n"
      "    $oneof_prefix$$name$_ = NULL;\n"
      "    return temp;\n"
      "  } else {\n"
      "    return NULL;\n"
      "  }\n"
      "}\n"
      "$inline$ void $classname$::unsafe_arena_set_allocated_$name$"
      "($type$* $name$) {\n"
      // We rely on the oneof clear method to free the earlier contents of this
      // oneof. We can directly use the pointer we're given to set the new
      // value.
      "  clear_$oneof_name$();\n"
      "  if ($name$) {\n"
      "    set_has_$name$();\n"
      "    $oneof_prefix$$name$_ = $name$;\n"
      "  }\n"
      "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:"
      "$full_name$)\n"
      "}\n");
  } else {
    printer->Print(variables,
      "$tmpl$"
      "$inline$"
      "$type$* $dependent_classname$::mutable_$name$() {\n"
      "  if (!$this_message$has_$name$()) {\n"
      "    $this_message$clear_$oneof_name$();\n"
      "    $this_message$set_has_$name$();\n"
      "    $field_member$ = new $dependent_typename$;\n"
      "  }\n"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return $field_member$;\n"
      "}\n"
      "$tmpl$"
      "$inline$"
      "$type$* $dependent_classname$::$release_name$() {\n"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "  if ($this_message$has_$name$()) {\n"
      "    $this_message$clear_has_$oneof_name$();\n"
      "    $dependent_typename$* temp = $field_member$;\n"
      "    $field_member$ = NULL;\n"
      "    return temp;\n"
      "  } else {\n"
      "    return NULL;\n"
      "  }\n"
      "}\n"
      "$tmpl$"
      "$inline$"
      "void $dependent_classname$::"
      "set_allocated_$name$($type$* $name$) {\n"
      "  $this_message$clear_$oneof_name$();\n"
      "  if ($name$) {\n");
    if (SupportsArenas(descriptor_->message_type())) {
      printer->Print(variables,
        "    if (static_cast< $dependent_typename$*>($name$)->"
        "GetArena() != NULL) {\n"
        "      $dependent_typename$* new_$name$ = new $dependent_typename$;\n"
        "      new_$name$->CopyFrom(*$name$);\n"
        "      $name$ = new_$name$;\n"
        "    }\n");
    }
    printer->Print(variables,
      "    $this_message$set_has_$name$();\n"
      "    $field_member$ = $name$;\n"
      "  }\n"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
  }
}